

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderResourceCacheGL::SetDynamicSSBOOffset
          (ShaderResourceCacheGL *this,Uint32 CacheOffset,Uint32 DynamicOffset)

{
  undefined4 uVar1;
  Char *Message;
  CachedSSBO *pCVar2;
  undefined1 local_38 [8];
  string msg;
  Uint32 DynamicOffset_local;
  Uint32 CacheOffset_local;
  ShaderResourceCacheGL *this_local;
  
  msg.field_2._8_4_ = DynamicOffset;
  msg.field_2._12_4_ = CacheOffset;
  if ((this->m_DynamicSSBOSlotMask & 1L << ((byte)CacheOffset & 0x3f)) == 0) {
    FormatString<char[61]>
              ((string *)local_38,
               (char (*) [61])"Attempting to set dynamic offset for a non-dynamic SSBO slot");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"SetDynamicSSBOOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourceCacheGL.hpp"
               ,0xf4);
    std::__cxx11::string::~string((string *)local_38);
  }
  uVar1 = msg.field_2._8_4_;
  pCVar2 = GetSSBO(this,msg.field_2._12_4_);
  pCVar2->DynamicOffset = uVar1;
  return;
}

Assistant:

void SetDynamicSSBOOffset(Uint32 CacheOffset, Uint32 DynamicOffset)
    {
        DEV_CHECK_ERR((m_DynamicSSBOSlotMask & (Uint64{1} << Uint64{CacheOffset})) != 0, "Attempting to set dynamic offset for a non-dynamic SSBO slot");
        GetSSBO(CacheOffset).DynamicOffset = DynamicOffset;
    }